

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O1

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall
               (QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QNonContiguousByteDeviceThreadForwardImpl_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == wantData) && (uVar2 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == processedData && (uVar2 = 1, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == resetData && (uVar2 = 2, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_00215a8a;
  }
  if (_c != InvokeMetaMethod) goto LAB_00215a8a;
  switch(_id) {
  case 0:
    local_40 = *_a[1];
    iVar3 = 0;
    break;
  case 1:
    local_40 = *_a[1];
    local_48 = *_a[2];
    iVar3 = 1;
    local_28 = (undefined1 *)&local_48;
    break;
  case 2:
    local_40 = *_a[1];
    iVar3 = 2;
    break;
  case 3:
    haveDataSlot((QNonContiguousByteDeviceThreadForwardImpl *)_o,*_a[1],(QByteArray *)_a[2],*_a[3],
                 *_a[4]);
  default:
    goto LAB_00215a8a;
  }
  puStack_30 = &local_40;
  local_38 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_38);
LAB_00215a8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNonContiguousByteDeviceThreadForwardImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->wantData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 1: _t->processedData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 2: _t->resetData((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 3: _t->haveDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::wantData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 , qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::processedData, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(bool * )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::resetData, 2))
            return;
    }
}